

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

double __thiscall Logger::log(Logger *this,double __x)

{
  char in_AL;
  __va_list_tag *in_XMM1_Qa;
  char *in_XMM1_Qb;
  Logger *in_XMM2_Qa;
  string *in_XMM5_Qb;
  undefined8 in_XMM6_Qa;
  Logger *in_XMM6_Qb;
  string message;
  va_list args;
  undefined1 local_118 [48];
  double local_e8;
  __va_list_tag *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  Logger *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  LogLevel level;
  Logger *in_stack_ffffffffffffff80;
  string local_58 [32];
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  Logger *local_8;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (in_AL != '\0') {
    local_e8 = __x;
    in_stack_ffffffffffffff28 = in_XMM1_Qa;
    in_stack_ffffffffffffff30 = in_XMM1_Qb;
    in_stack_ffffffffffffff38 = in_XMM2_Qa;
    in_stack_ffffffffffffff70 = in_XMM5_Qb;
    in_stack_ffffffffffffff80 = in_XMM6_Qb;
    level = (LogLevel)((ulong)in_XMM6_Qa >> 0x20);
  }
  if ((this->running & 1U) != 0) {
    local_28 = local_118;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_8 = this;
    format_abi_cxx11_(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
    ;
    addLogQueue(in_stack_ffffffffffffff80,level,in_stack_ffffffffffffff70);
    __x = (double)std::__cxx11::string::~string(local_58);
  }
  return __x;
}

Assistant:

inline void log(LogLevel level, const char* fmt, ...) 
    {
        if(!running) return;
        va_list args;
        va_start(args, fmt);
        std::string message = format(fmt, args);
        va_end(args);
        addLogQueue(level, message);
    }